

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DescriptorPoolDatabaseTest_StripSourceCodeInfo_Test::
~DescriptorPoolDatabaseTest_StripSourceCodeInfo_Test
          (DescriptorPoolDatabaseTest_StripSourceCodeInfo_Test *this)

{
  DescriptorPoolDatabaseTest_StripSourceCodeInfo_Test *this_local;
  
  ~DescriptorPoolDatabaseTest_StripSourceCodeInfo_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DescriptorPoolDatabaseTest, StripSourceCodeInfo) {
  SimpleDescriptorDatabase original_db;
  AddToDatabase(&original_db, R"pb(
    name: "foo.proto"
    package: "foo"
    message_type {
      name: "Foo"
      extension_range { start: 1 end: 100 }
    }
    extension {
      name: "foo_ext"
      extendee: ".foo.Foo"
      number: 3
      label: LABEL_OPTIONAL
      type: TYPE_INT32
    }
    source_code_info { location { leading_detached_comments: "comment" } }
  )pb");
  DescriptorPool pool(&original_db);
  DescriptorPoolDatabase db(pool);

  FileDescriptorProto file;
  ASSERT_TRUE(db.FindFileByName("foo.proto", &file));
  EXPECT_FALSE(file.has_source_code_info());

  ASSERT_TRUE(db.FindFileContainingExtension("foo.Foo", 3, &file));
  EXPECT_FALSE(file.has_source_code_info());

  ASSERT_TRUE(db.FindFileContainingSymbol("foo.Foo", &file));
  EXPECT_FALSE(file.has_source_code_info());
}